

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix-ops.impl.hpp
# Opt level: O3

matrixOps * __thiscall
pobr::imgProcessing::utils::matrixOps::applyKernel<cv::Vec<unsigned_char,3>,double,double>
          (matrixOps *this,Mat *img,Mat *kernel,double accumulatorInit,
          function<double_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_const_cv::Vec<unsigned_char,_3>_&,_const_double_&)>
          *reducer,function<void_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_cv::Vec<unsigned_char,_3>_&,_const_cv::Mat_&)>
                   *applicator)

{
  uint kernelOffsetX;
  uint kernelOffsetY;
  uint endCol;
  uint endRow;
  uint initCol;
  uint initRow;
  uint local_68;
  uint local_64;
  int local_60;
  int local_5c;
  uint local_58;
  uint local_54;
  double local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  local_50 = accumulatorInit;
  cv::Mat::clone();
  local_64 = (*(int *)(kernel + 8) - (*(int *)(kernel + 8) + -1 >> 0x1f)) + -1 >> 1;
  local_68 = (*(int *)(kernel + 0xc) - (*(int *)(kernel + 0xc) + -1 >> 0x1f)) + -1 >> 1;
  local_5c = ~local_64 + *(int *)(img + 8);
  local_60 = ~local_68 + *(int *)(img + 0xc);
  local_48._8_8_ = 0;
  local_58 = local_68;
  local_54 = local_64;
  local_48._M_unused._M_object = operator_new(0x60);
  *(uint **)local_48._M_unused._0_8_ = &local_58;
  *(uint **)((long)local_48._M_unused._0_8_ + 8) = &local_54;
  *(int **)((long)local_48._M_unused._0_8_ + 0x10) = &local_60;
  *(int **)((long)local_48._M_unused._0_8_ + 0x18) = &local_5c;
  *(Mat **)((long)local_48._M_unused._0_8_ + 0x20) = kernel;
  *(double **)((long)local_48._M_unused._0_8_ + 0x28) = &local_50;
  *(Mat **)((long)local_48._M_unused._0_8_ + 0x30) = img;
  *(uint **)((long)local_48._M_unused._0_8_ + 0x38) = &local_64;
  *(uint **)((long)local_48._M_unused._0_8_ + 0x40) = &local_68;
  *(function<double_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_const_cv::Vec<unsigned_char,_3>_&,_const_double_&)>
    **)((long)local_48._M_unused._0_8_ + 0x48) = reducer;
  *(matrixOps **)((long)local_48._M_unused._0_8_ + 0x50) = this;
  *(function<void_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_cv::Vec<unsigned_char,_3>_&,_const_cv::Mat_&)>
    **)((long)local_48._M_unused._0_8_ + 0x58) = applicator;
  local_30 = std::
             _Function_handler<void_(const_unsigned_long_&,_const_unsigned_long_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mdziekon[P]eiti-pobr-logo-recognition/src/img-processing/utils/././matrix-ops.impl.hpp:49:9)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(const_unsigned_long_&,_const_unsigned_long_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mdziekon[P]eiti-pobr-logo-recognition/src/img-processing/utils/././matrix-ops.impl.hpp:49:9)>
             ::_M_manager;
  forEachPixel((Mat *)this,
               (function<void_(const_unsigned_long_&,_const_unsigned_long_&)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return this;
}

Assistant:

cv::Mat
matrixOps::applyKernel(
    const cv::Mat& img,
    const cv::Mat& kernel,
    Acc accumulatorInit,
    const std::function<Acc(const uint64_t& x, const uint64_t& y, Acc& accumulator, const PixelClass& pixel, const KernelValue& kernelValue)>& reducer,
    const std::function<void(const uint64_t& x, const uint64_t& y, Acc& accumulator, PixelClass& pixel, const cv::Mat& img)>& applicator
)
{
    // Uses edge cropping
    auto resultImg = img.clone();

    const unsigned int initRow = 0 + ((kernel.rows - 1) / 2);
    const unsigned int initCol = 0 + ((kernel.cols - 1) / 2);

    const unsigned int endRow = (img.rows - 1) - initRow;
    const unsigned int endCol = (img.cols - 1) - initCol;

    const unsigned int kernelOffsetY = 0 + ((kernel.rows - 1) / 2);
    const unsigned int kernelOffsetX = 0 + ((kernel.cols - 1) / 2);

    matrixOps::forEachPixel(
        resultImg,
        [&](const uint64_t& x, const uint64_t& y) -> void
        {
            if (x < initCol) {
                return;
            }
            if (y < initRow) {
                return;
            }
            if (x > endCol) {
                return;
            }
            if (y > endRow) {
                return;
            }

            Acc value = matrixOps::reduceEachPixel<Acc>(
                kernel,
                accumulatorInit,
                [&](const uint64_t& kernelX, const uint64_t& kernelY, Acc& accumulator) -> Acc
                {
                    auto& thisKernelValue = kernel.at<KernelValue>(kernelY, kernelX);
                    auto& adjacentPixel = img.at<PixelClass>(
                        y - kernelOffsetY + kernelY,
                        x - kernelOffsetX + kernelX
                    );

                    return reducer(x, y, accumulator, adjacentPixel, thisKernelValue);
                }
            );

            auto& thisPixel = resultImg.at<PixelClass>(y, x);

            applicator(x, y, value, thisPixel, img);
        }
    );

    return resultImg;
}